

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::visitSymbol
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  Builder *this_00;
  bool bVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  TIntermediate *this_01;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  StorageClass SVar8;
  Id typeId;
  Id IVar9;
  Id IVar10;
  Op OVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *pmVar12;
  undefined4 extraout_var_04;
  long lVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  iterator iVar14;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TTypeList *pTVar15;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  iterator iVar16;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  iterator iVar17;
  undefined4 extraout_var_17;
  mapped_type *ppTVar18;
  ulong uVar19;
  uint typeId_00;
  char *pcVar20;
  SpvBuildLogger *this_02;
  Id id;
  Id local_80;
  Id local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components;
  
  if (this->linkageOnly == false) {
    iVar6 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(symbol);
    iVar6 = *(int *)(CONCAT44(extraout_var,iVar6) + 0xc);
    iVar7 = (**(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(symbol);
    if (*(long *)CONCAT44(extraout_var_00,iVar7) == 0) {
      pcVar20 = (char *)0x0;
    }
    else {
      pcVar20 = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 8);
    }
    spv::Builder::setDebugSourceLocation(&this->builder,iVar6,pcVar20);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar6 == 0x16) {
    return;
  }
  bVar1 = (this->builder).generatingOpCodeForSpecConst;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x128))
                    ((long *)CONCAT44(extraout_var_01,iVar6));
  if (cVar4 != '\0') {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)glslang::TType::getStruct((TType *)CONCAT44(extraout_var_03,iVar7));
    pmVar12 = std::__detail::
              _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->glslangTypeToIdMap,(key_type *)&components);
    *pmVar12 = CONCAT44(extraout_var_02,iVar6);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_04,iVar6));
  if ((*(byte *)(lVar13 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar6 == 0x1b) goto LAB_0033b9ac;
  id = getSymbolId(this,symbol);
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_05,iVar6));
  if ((*(uint *)(lVar13 + 8) & 0x7f) == 0xf) {
    this->taskPayloadID = id;
  }
  ppIVar2 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar3 = ppIVar2[id];
  if (pIVar3 == (Instruction *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (ulong)pIVar3->typeId;
  }
  this_00 = &this->builder;
  IVar10 = id;
  if (ppIVar2[uVar19]->opCode == OpTypePointer) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_06,iVar6));
    if ((0x13 < (*(uint *)(lVar13 + 8) & 0x7f)) ||
       ((0xd0000U >> (*(uint *)(lVar13 + 8) & 0x1f) & 1) == 0)) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_08,iVar6));
      if (1 < (*(uint *)(lVar13 + 8) & 0x7f) - 0x11) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x128))
                          ((long *)CONCAT44(extraout_var_09,iVar6));
        if (cVar4 != '\0') {
          iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          pTVar15 = glslang::TType::getStruct((TType *)CONCAT44(extraout_var_10,iVar6));
          if ((pTVar15->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (pTVar15->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start) goto LAB_0033b48e;
        }
        SVar8 = spv::Builder::getStorageClass(this_00,id);
        if (((0x103ff < (this->glslangIntermediate->spvVersion).spv) &&
            (bVar5 = spv::Builder::isGlobalVariable(this_00,id), bVar5)) ||
           ((SVar8 | StorageClassUniform) == Output)) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&this->iOSet,&id);
        }
      }
    }
LAB_0033b48e:
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_07,iVar6));
    IVar10 = id;
    if ((*(uint *)(lVar13 + 8) & 0x7f) == 3) {
      local_78._M_dataplus._M_p._0_4_ = id;
      iVar14 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->forceType)._M_h,(key_type *)&local_78);
      IVar10 = (Id)local_78._M_dataplus._M_p;
      if (iVar14.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur != (__node_type *)0x0) {
        ppIVar2 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar2[(Id)local_78._M_dataplus._M_p];
        if (pIVar3 == (Instruction *)0x0) {
          typeId_00 = 0;
        }
        else {
          typeId_00 = pIVar3->typeId;
        }
        if (ppIVar2[typeId_00]->opCode != OpTypePointer) {
          __assert_fail("builder.isPointerType(objectTypeId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x9ea,
                        "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::translateForcedType(spv::Id)"
                       );
        }
        IVar10 = *(Id *)((long)iVar14.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 0xc);
        typeId = spv::Builder::getContainedTypeId(this_00,typeId_00);
        OVar11 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[typeId]->opCode;
        if (OVar11 == OpTypeVector) {
          IVar9 = spv::Builder::getContainedTypeId(this_00,typeId);
          iVar6 = spv::Builder::getScalarTypeWidth(this_00,IVar9);
          if (iVar6 != 0x20) {
            OVar11 = (this->builder).module.idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[typeId]->opCode;
            goto LAB_0033b71d;
          }
          iVar6 = spv::Builder::getScalarTypeWidth(this_00,IVar10);
          if (iVar6 == 0x40) {
            spv::Builder::clearAccessChain(this_00);
            spv::Builder::setAccessChainLValue(this_00,(Id)local_78._M_dataplus._M_p);
            IVar9 = spv::Builder::accessChainLoad
                              (this_00,DecorationMax,DecorationMax,DecorationMax,typeId,MaskNone,Max
                               ,0);
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_7c = IVar10;
            local_78._M_dataplus._M_p._0_4_ = IVar9;
            IVar10 = spv::Builder::getContainedTypeId(this_00,typeId);
            local_80 = spv::Builder::createCompositeExtract(this_00,IVar9,IVar10,0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&components,&local_80);
            IVar10 = (Id)local_78._M_dataplus._M_p;
            IVar9 = spv::Builder::getContainedTypeId(this_00,typeId);
            local_80 = spv::Builder::createCompositeExtract(this_00,IVar10,IVar9,1);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                       &local_80);
            IVar10 = spv::Builder::getContainedTypeId(this_00,typeId);
            IVar10 = spv::Builder::makeVectorType(this_00,IVar10,2);
            IVar10 = spv::Builder::createCompositeConstruct
                               (this_00,IVar10,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &components.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            IVar10 = spv::Builder::createUnaryOp(this_00,OpBitcast,local_7c,IVar10);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            goto LAB_0033b7bb;
          }
          this_02 = this->logger;
          pcVar20 = "forcing 32-bit vector type to non 64-bit scalar";
        }
        else {
LAB_0033b71d:
          if (OVar11 == OpTypeMatrix) {
            spv::Builder::clearAccessChain(this_00);
            spv::Builder::setAccessChainLValue(this_00,(Id)local_78._M_dataplus._M_p);
            local_78._M_dataplus._M_p._0_4_ =
                 spv::Builder::accessChainLoad
                           (this_00,DecorationMax,DecorationMax,DecorationMax,typeId,MaskNone,Max,0)
            ;
            IVar10 = spv::Builder::createUnaryOp
                               (this_00,OpTranspose,IVar10,(Id)local_78._M_dataplus._M_p);
            goto LAB_0033b7bb;
          }
          this_02 = this->logger;
          pcVar20 = "forcing non 32-bit vector type";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,pcVar20,(allocator<char> *)&local_80);
        spv::SpvBuildLogger::missingFunctionality(this_02,(string *)&components);
        std::__cxx11::string::_M_dispose();
        IVar10 = (Id)local_78._M_dataplus._M_p;
      }
    }
  }
LAB_0033b7bb:
  id = IVar10;
  if ((this->linkageOnly != true) ||
     (iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol),
     (*(ulong *)(CONCAT44(extraout_var_11,iVar6) + 8) & 0x100000000) != 0)) {
    spv::Builder::clearAccessChain(this_00);
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
    if ((*(ulong *)(CONCAT44(extraout_var_12,iVar6) + 8) & 0x100000000) == 0) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_13,iVar6);
      iVar16 = std::
               _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(this->rValueParameters)._M_h,(key_type_conflict2 *)&components);
      if (iVar16.super__Node_iterator_base<long_long,_false>._M_cur == (__node_type *)0x0) {
        ppIVar2 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar2[id];
        if (pIVar3 == (Instruction *)0x0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (ulong)pIVar3->typeId;
        }
        if (ppIVar2[uVar19]->opCode == OpTypePointer) {
          spv::Builder::setAccessChainLValue(this_00,id);
          goto LAB_0033b837;
        }
      }
    }
    (this->builder).accessChain.isRValue = true;
    (this->builder).accessChain.base = id;
  }
LAB_0033b837:
  if ((this->linkageOnly == true) && (this->glslangIntermediate->hlslFunctionality1 == true)) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_14,iVar6));
    if ((*(uint *)(lVar13 + 8) & 0x7f) - 5 < 2) {
      this_01 = this->glslangIntermediate;
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      bVar5 = glslang::TIntermediate::hasCounterBufferName
                        (this_01,(TString *)CONCAT44(extraout_var_15,iVar6));
      if (bVar5) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,*(char **)(CONCAT44(extraout_var_16,iVar6) + 8),
                   (allocator<char> *)&local_78);
        iVar17 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->counterOriginator)._M_h,(key_type *)&components);
        if (((iVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
              ._M_cur != (__node_type *)0x0) &&
            (id = getSymbolId(this,*(TIntermSymbol **)
                                    ((long)iVar17.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_true>
                                           ._M_cur + 0x28)), id != 0)) &&
           (IVar10 = getSymbolId(this,symbol), IVar10 != 0)) {
          spv::Builder::addExtension(this_00,"SPV_GOOGLE_hlsl_functionality1");
          spv::Builder::addDecorationId(this_00,id,CounterBuffer,IVar10);
        }
      }
      else {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&components,*(char **)(CONCAT44(extraout_var_17,iVar6) + 8),
                   (allocator<char> *)&local_78);
        glslang::TIntermediate::addCounterBufferName<std::__cxx11::string>
                  (&local_78,this->glslangIntermediate,(key_type *)&components);
        std::__cxx11::string::operator=((string *)&components,(string *)&local_78);
        std::__cxx11::string::_M_dispose();
        ppTVar18 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->counterOriginator,(key_type *)&components);
        *ppTVar18 = symbol;
      }
      std::__cxx11::string::_M_dispose();
    }
  }
LAB_0033b9ac:
  (this->builder).generatingOpCodeForSpecConst = bVar1;
  return;
}

Assistant:

void TGlslangToSpvTraverser::visitSymbol(glslang::TIntermSymbol* symbol)
{
    // We update the line information even though no code might be generated here
    // This is helpful to yield correct lines for control flow instructions
    if (!linkageOnly) {
        builder.setDebugSourceLocation(symbol->getLoc().line, symbol->getLoc().getFilename());
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return;
    }

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (symbol->getType().isStruct())
        glslangTypeToIdMap[symbol->getType().getStruct()] = symbol->getId();

    if (symbol->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
#ifdef ENABLE_HLSL
    // Skip symbol handling if it is string-typed
    if (symbol->getBasicType() == glslang::EbtString)
        return;
#endif

    // getSymbolId() will set up all the IO decorations on the first call.
    // Formal function parameters were mapped during makeFunctions().
    spv::Id id = getSymbolId(symbol);

    if (symbol->getType().getQualifier().isTaskPayload())
        taskPayloadID = id; // cache the taskPayloadID to be used it as operand for OpEmitMeshTasksEXT

    if (builder.isPointer(id)) {
        if (!symbol->getType().getQualifier().isParamInput() &&
            !symbol->getType().getQualifier().isParamOutput()) {
            // Include all "static use" and "linkage only" interface variables on the OpEntryPoint instruction
            // Consider adding to the OpEntryPoint interface list.
            // Only looking at structures if they have at least one member.
            if (!symbol->getType().isStruct() || symbol->getType().getStruct()->size() > 0) {
                spv::StorageClass sc = builder.getStorageClass(id);
                // Before SPIR-V 1.4, we only want to include Input and Output.
                // Starting with SPIR-V 1.4, we want all globals.
                if ((glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4 && builder.isGlobalVariable(id)) ||
                    (sc == spv::StorageClassInput || sc == spv::StorageClassOutput)) {
                    iOSet.insert(id);
                }
            }
        }

        // If the SPIR-V type is required to be different than the AST type
        // (for ex SubgroupMasks or 3x4 ObjectToWorld/WorldToObject matrices),
        // translate now from the SPIR-V type to the AST type, for the consuming
        // operation.
        // Note this turns it from an l-value to an r-value.
        // Currently, all symbols needing this are inputs; avoid the map lookup when non-input.
        if (symbol->getType().getQualifier().storage == glslang::EvqVaryingIn)
            id = translateForcedType(id);
    }

    // Only process non-linkage-only nodes for generating actual static uses
    if (! linkageOnly || symbol->getQualifier().isSpecConstant()) {
        // Prepare to generate code for the access

        // L-value chains will be computed left to right.  We're on the symbol now,
        // which is the left-most part of the access chain, so now is "clear" time,
        // followed by setting the base.
        builder.clearAccessChain();

        // For now, we consider all user variables as being in memory, so they are pointers,
        // except for
        // A) R-Value arguments to a function, which are an intermediate object.
        //    See comments in handleUserFunctionCall().
        // B) Specialization constants (normal constants don't even come in as a variable),
        //    These are also pure R-values.
        // C) R-Values from type translation, see above call to translateForcedType()
        glslang::TQualifier qualifier = symbol->getQualifier();
        if (qualifier.isSpecConstant() || rValueParameters.find(symbol->getId()) != rValueParameters.end() ||
            !builder.isPointerType(builder.getTypeId(id)))
            builder.setAccessChainRValue(id);
        else
            builder.setAccessChainLValue(id);
    }

#ifdef ENABLE_HLSL
    // Process linkage-only nodes for any special additional interface work.
    if (linkageOnly) {
        if (glslangIntermediate->getHlslFunctionality1()) {
            // Map implicit counter buffers to their originating buffers, which should have been
            // seen by now, given earlier pruning of unused counters, and preservation of order
            // of declaration.
            if (symbol->getType().getQualifier().isUniformOrBuffer()) {
                if (!glslangIntermediate->hasCounterBufferName(symbol->getName())) {
                    // Save possible originating buffers for counter buffers, keyed by
                    // making the potential counter-buffer name.
                    std::string keyName = symbol->getName().c_str();
                    keyName = glslangIntermediate->addCounterBufferName(keyName);
                    counterOriginator[keyName] = symbol;
                } else {
                    // Handle a counter buffer, by finding the saved originating buffer.
                    std::string keyName = symbol->getName().c_str();
                    auto it = counterOriginator.find(keyName);
                    if (it != counterOriginator.end()) {
                        id = getSymbolId(it->second);
                        if (id != spv::NoResult) {
                            spv::Id counterId = getSymbolId(symbol);
                            if (counterId != spv::NoResult) {
                                builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
                                builder.addDecorationId(id, spv::DecorationHlslCounterBufferGOOGLE, counterId);
                            }
                        }
                    }
                }
            }
        }
    }
#endif
}